

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::setStartId(QWizard *this,int theid)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int newStart;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  local_1c = theid;
  if (theid == -1) {
    lVar2 = *(long *)(lVar1 + 0x2e0);
    local_1c = -1;
    if ((lVar2 != 0) && (*(long *)(lVar2 + 0x30) != 0)) {
      local_1c = *(int *)(*(long *)(lVar2 + 0x20) + 0x20);
    }
  }
  if (*(int *)(lVar1 + 0x338) != local_1c) {
    bVar3 = QMap<int,_QWizardPage_*>::contains
                      ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&stack0xffffffffffffffe4);
    if (!bVar3) {
      setStartId((QWizard *)&stack0xffffffffffffffe4);
      goto LAB_0050db31;
    }
    *(int *)(lVar1 + 0x338) = local_1c;
  }
  *(bool *)(lVar1 + 0x33c) = theid != -1;
LAB_0050db31:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setStartId(int theid)
{
    Q_D(QWizard);
    int newStart = theid;
    if (theid == -1)
        newStart = d->pageMap.size() ? d->pageMap.constBegin().key() : -1;

    if (d->start == newStart) {
        d->startSetByUser = theid != -1;
        return;
    }

    if (Q_UNLIKELY(!d->pageMap.contains(newStart))) {
        qWarning("QWizard::setStartId: Invalid page ID %d", newStart);
        return;
    }
    d->start = newStart;
    d->startSetByUser = theid != -1;
}